

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

int tinyusdz::USDZResolveAsset
              (char *asset_name,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *search_paths,string *resolved_asset_name,string *err,void *userdata)

{
  bool bVar1;
  size_type sVar2;
  int iVar3;
  allocator local_91;
  string asset_path;
  string local_70;
  string local_50;
  
  if (((userdata == (void *)0x0) || (asset_name == (char *)0x0)) ||
     (resolved_asset_name == (string *)0x0)) {
    iVar3 = -2;
    if (err != (string *)0x0) {
      iVar3 = -2;
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    ::std::__cxx11::string::string((string *)&asset_path,asset_name,(allocator *)&local_70);
    ::std::__cxx11::string::string((string *)&local_70,"./",(allocator *)&local_50);
    bVar1 = startsWith(&asset_path,&local_70);
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      ::std::__cxx11::string::string((string *)&local_50,"./",&local_91);
      removePrefix(&local_70,&asset_path,&local_50);
      ::std::__cxx11::string::operator=((string *)&asset_path,(string *)&local_70);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)userdata,&asset_path);
    if (sVar2 == 0) {
      iVar3 = -1;
    }
    else {
      ::std::__cxx11::string::_M_assign((string *)resolved_asset_name);
      iVar3 = 0;
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return iVar3;
}

Assistant:

int USDZResolveAsset(const char *asset_name, const std::vector<std::string> &search_paths, std::string *resolved_asset_name, std::string *err, void *userdata) {

  DCOUT("Resolve asset: " << asset_name);

  if (!userdata) {
    if (err) {
      (*err) += "`userdata` must be non-null.\n";
    }
    return -2;
  }

  if (!asset_name) {
    if (err) {
      (*err) += "`asset_name` must be non-null.\n";
    }
    return -2;
  }

  if (!resolved_asset_name) {
    if (err) {
      (*err) += "`resolved_asset_name` must be non-null.\n";
    }
    return -2;
  }

  std::string asset_path = asset_name;

  // Remove relative path prefix './'
  if (tinyusdz::startsWith(asset_path, "./")) {
    asset_path = tinyusdz::removePrefix(asset_path, "./");
  }

  // Not used
  (void)search_paths;

  const USDZAsset *passet = reinterpret_cast<const USDZAsset *>(userdata);

  if (passet->asset_map.count(asset_path)) {
    DCOUT("Resolved asset: " << asset_name << " as " << asset_path);
    (*resolved_asset_name) = asset_path;
    return 0;
  }

  return -1; // not found
}